

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

bool FileStream_Replace(TFileStream *pStream,TFileStream *pNewStream)

{
  bool bVar1;
  TFileStream *pNewStream_local;
  TFileStream *pStream_local;
  
  if ((pStream->dwFlags & 0xff) == 0) {
    if ((pStream->dwFlags & 0x100) == 0) {
      (*pNewStream->BaseClose)(pNewStream);
      (*pStream->BaseClose)(pStream);
      bVar1 = BaseFile_Replace(pStream,pNewStream);
      if (bVar1) {
        bVar1 = BaseFile_Open(pStream,pStream->szFileName,pStream->dwFlags);
        if (bVar1) {
          FileStream_Close(pNewStream);
          pStream_local._7_1_ = true;
        }
        else {
          pStream_local._7_1_ = false;
        }
      }
      else {
        pStream_local._7_1_ = false;
      }
    }
    else {
      SetLastError(1);
      pStream_local._7_1_ = false;
    }
  }
  else {
    SetLastError(0x5f);
    pStream_local._7_1_ = false;
  }
  return pStream_local._7_1_;
}

Assistant:

bool FileStream_Replace(TFileStream * pStream, TFileStream * pNewStream)
{
    // Only supported on flat files
    if((pStream->dwFlags & STREAM_PROVIDERS_MASK) != (STREAM_PROVIDER_FLAT | BASE_PROVIDER_FILE))
    {
        SetLastError(ERROR_NOT_SUPPORTED);
        return false;
    }

    // Not supported on read-only streams
    if(pStream->dwFlags & STREAM_FLAG_READ_ONLY)
    {
        SetLastError(ERROR_ACCESS_DENIED);
        return false;
    }

    // Close both stream's base providers
    pNewStream->BaseClose(pNewStream);
    pStream->BaseClose(pStream);

    // Now we have to delete the (now closed) old file and rename the new file
    if(!BaseFile_Replace(pStream, pNewStream))
        return false;

    // Now open the base file again
    if(!BaseFile_Open(pStream, pStream->szFileName, pStream->dwFlags))
        return false;

    // Cleanup the new stream
    FileStream_Close(pNewStream);
    return true;
}